

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void update_history(char *flname)

{
  byte *pbVar1;
  Fl_Menu_Item *pFVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char (*pacVar7) [2048];
  long lVar8;
  int max_files;
  Name local_840;
  char absolute [2048];
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&max_files,5);
  if (10 < max_files) {
    max_files = 10;
  }
  fl_filename_absolute(absolute,0x800,flname);
  iVar4 = max_files;
  lVar8 = (long)max_files;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < max_files) {
    uVar6 = (ulong)(uint)max_files;
  }
  pacVar7 = absolute_history;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    iVar3 = strcmp(absolute,*pacVar7);
    if (iVar3 == 0) {
      uVar6 = uVar5 & 0xffffffff;
      break;
    }
    pacVar7 = pacVar7 + 1;
  }
  if ((int)uVar6 != 0) {
    iVar4 = iVar4 + -1;
    if ((long)uVar5 < lVar8) {
      iVar4 = (int)uVar6;
    }
    pacVar7 = absolute_history;
    memmove(absolute_history + 1,absolute_history,(long)iVar4 << 0xb);
    memmove(relative_history + 1,relative_history,(long)iVar4 << 0xb);
    fl_strlcpy(absolute_history[0],absolute,0x800);
    fl_filename_relative(relative_history[0],0x800,absolute_history[0]);
    lVar8 = 0x20;
    for (uVar5 = 0; (long)uVar5 < (long)max_files; uVar5 = uVar5 + 1) {
      Fl_Preferences::Name::Name(&local_840,"file%d",uVar5 & 0xffffffff);
      Fl_Preferences::set(&fluid_prefs,local_840.data_,*pacVar7);
      Fl_Preferences::Name::~Name(&local_840);
      if ((*pacVar7)[0] == '\0') break;
      if (uVar5 == 9) {
        history_item[9].flags = 0x80;
      }
      else {
        *(undefined4 *)((long)&history_item->text + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x38;
      pacVar7 = pacVar7 + 1;
    }
    for (; uVar5 < 10; uVar5 = uVar5 + 1) {
      Fl_Preferences::Name::Name(&local_840,"file%d",uVar5 & 0xffffffff);
      Fl_Preferences::set(&fluid_prefs,local_840.data_,"");
      Fl_Preferences::Name::~Name(&local_840);
      pFVar2 = history_item;
      if (uVar5 != 0) {
        pbVar1 = (byte *)((long)&history_item[-1].text + lVar8);
        *pbVar1 = *pbVar1 | 0x80;
      }
      pbVar1 = (byte *)((long)&pFVar2->text + lVar8);
      *pbVar1 = *pbVar1 | 0x10;
      lVar8 = lVar8 + 0x38;
    }
    Fl_Preferences::flush(&fluid_prefs);
  }
  return;
}

Assistant:

void update_history(const char *flname) {
  int	i;		// Looping var
  char	absolute[FL_PATH_MAX];
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  fl_filename_absolute(absolute, sizeof(absolute), flname);

  for (i = 0; i < max_files; i ++)
#if defined(WIN32) || defined(__APPLE__)
    if (!strcasecmp(absolute, absolute_history[i])) break;
#else
    if (!strcmp(absolute, absolute_history[i])) break;
#endif // WIN32 || __APPLE__

  if (i == 0) return;

  if (i >= max_files) i = max_files - 1;

  // Move the other flnames down in the list...
  memmove(absolute_history + 1, absolute_history,
          i * sizeof(absolute_history[0]));
  memmove(relative_history + 1, relative_history,
          i * sizeof(relative_history[0]));

  // Put the new file at the top...
  strlcpy(absolute_history[0], absolute, sizeof(absolute_history[0]));

  fl_filename_relative(relative_history[0], sizeof(relative_history[0]),
                       absolute_history[0]);

  // Update the menu items as needed...
  for (i = 0; i < max_files; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), absolute_history[i]);
    if (absolute_history[i][0]) {
      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), "");
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
  fluid_prefs.flush();
}